

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDCImporter::ValidateHeader(MDCImporter *this)

{
  Header *pHVar1;
  Logger *this_00;
  runtime_error *prVar2;
  size_t sVar3;
  char szBuffer [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char local_45 [4];
  undefined1 local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pHVar1 = this->pcHeader;
  if ((pHVar1->ulIdent != 0x43504449) && (pHVar1->ulIdent != 0x49445043)) {
    local_45[0] = (char)pHVar1->ulIdent;
    local_45[1] = *(undefined1 *)((long)&pHVar1->ulIdent + 1);
    local_45[2] = *(undefined1 *)((long)&pHVar1->ulIdent + 2);
    local_45[3] = *(undefined1 *)((long)&pHVar1->ulIdent + 3);
    local_41 = 0;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar3 = strlen(local_45);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,local_45,local_45 + sVar3);
    std::operator+(&local_68,"Invalid MDC magic word: should be IDPC, the magic word found is ",
                   &local_40);
    std::runtime_error::runtime_error(prVar2,(string *)&local_68);
    *(undefined ***)prVar2 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pHVar1->ulVersion != 2) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unsupported MDC file version (2 (AI_MDC_VERSION) was expected)");
  }
  pHVar1 = this->pcHeader;
  if ((ulong)pHVar1->ulNumFrames * 0x38 + (ulong)pHVar1->ulOffsetBorderFrames <=
      (ulong)this->fileSize) {
    if ((ulong)pHVar1->ulNumSurfaces * 0x7c + (ulong)pHVar1->ulOffsetSurfaces <=
        (ulong)this->fileSize) {
      if (this->configFrameID < pHVar1->ulNumFrames) {
        return;
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"The requested frame is not available","");
      std::runtime_error::runtime_error(prVar2,(string *)&local_68);
      *(undefined ***)prVar2 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Some of the offset values in the MDC header are invalid and point to something behind the file."
             ,"");
  std::runtime_error::runtime_error(prVar2,(string *)&local_68);
  *(undefined ***)prVar2 = &PTR__runtime_error_0082bce0;
  __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDCImporter::ValidateHeader()
{
    AI_SWAP4( this->pcHeader->ulVersion );
    AI_SWAP4( this->pcHeader->ulFlags );
    AI_SWAP4( this->pcHeader->ulNumFrames );
    AI_SWAP4( this->pcHeader->ulNumTags );
    AI_SWAP4( this->pcHeader->ulNumSurfaces );
    AI_SWAP4( this->pcHeader->ulNumSkins );
    AI_SWAP4( this->pcHeader->ulOffsetBorderFrames );

    if (pcHeader->ulIdent != AI_MDC_MAGIC_NUMBER_BE &&
        pcHeader->ulIdent != AI_MDC_MAGIC_NUMBER_LE)
    {
        char szBuffer[5];
        szBuffer[0] = ((char*)&pcHeader->ulIdent)[0];
        szBuffer[1] = ((char*)&pcHeader->ulIdent)[1];
        szBuffer[2] = ((char*)&pcHeader->ulIdent)[2];
        szBuffer[3] = ((char*)&pcHeader->ulIdent)[3];
        szBuffer[4] = '\0';

        throw DeadlyImportError("Invalid MDC magic word: should be IDPC, the "
            "magic word found is " + std::string( szBuffer ));
    }

    if (pcHeader->ulVersion != AI_MDC_VERSION) {
        ASSIMP_LOG_WARN("Unsupported MDC file version (2 (AI_MDC_VERSION) was expected)");
    }

    if (pcHeader->ulOffsetBorderFrames + pcHeader->ulNumFrames * sizeof(MDC::Frame) > this->fileSize ||
        pcHeader->ulOffsetSurfaces + pcHeader->ulNumSurfaces * sizeof(MDC::Surface) > this->fileSize)
    {
        throw DeadlyImportError("Some of the offset values in the MDC header are invalid "
            "and point to something behind the file.");
    }

    if (this->configFrameID >= this->pcHeader->ulNumFrames) {
        throw DeadlyImportError("The requested frame is not available");
    }
}